

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v5::format<char[8],unsigned_long,int>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v5 *this,char (*format_str) [8],unsigned_long *args,int *args_1)

{
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  char local_38 [2] [8];
  ulong local_28;
  
  format_str_00 = to_string_view<char>((char *)this);
  local_38[0] = *format_str;
  local_28 = (ulong)(uint)*args;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_38;
  args_00.types_ =
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long,int>
       ::TYPES;
  internal::vformat<char>(__return_storage_ptr__,format_str_00,args_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}